

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

size_t ggml_quantize_chunk(ggml_type type,float *src,void *dst,int64_t start,int64_t nrows,
                          int64_t n_per_row,float *imatrix)

{
  float fVar1;
  long lVar2;
  ulong uVar3;
  size_t __n;
  char *pcVar4;
  ushort uVar5;
  int line;
  long n;
  ulong uVar6;
  
  if (imatrix == (float *)0x0 &&
      (type == GGML_TYPE_IQ1_S || (type & ~GGML_TYPE_F16) == GGML_TYPE_IQ2_XXS)) {
    pcVar4 = "imatrix != NULL";
    line = 0x192e;
    goto LAB_00123653;
  }
  uVar6 = (ulong)type;
  uVar3 = type_traits[uVar6].blck_size;
  if (start % (long)uVar3 != 0) {
    pcVar4 = "start % type_traits[type].blck_size == 0";
    line = 0x1931;
    goto LAB_00123653;
  }
  lVar2 = start / n_per_row;
  if (start % n_per_row != 0) {
    pcVar4 = "start % n_per_row == 0";
    line = 0x1932;
    goto LAB_00123653;
  }
  ggml_quantize_init(type);
  __n = 0;
  uVar3 = (type_traits[uVar6].type_size * n_per_row) / uVar3;
  if (GGML_TYPE_TQ2_0 < type) goto switchD_0012314a_caseD_4;
  n = n_per_row * nrows;
  switch(uVar6) {
  case 0:
    __n = n * 4;
    memcpy((void *)((long)dst + start * 4),src + start,__n);
    break;
  case 1:
    ggml_fp32_to_fp16_row(src + start,(ggml_fp16_t *)((long)dst + start * 2),n);
    goto LAB_001233bb;
  case 2:
    __n = quantize_q4_0(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 3:
    __n = quantize_q4_1(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 6:
    __n = quantize_q5_0(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 7:
    __n = quantize_q5_1(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 8:
    __n = quantize_q8_0(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 10:
    __n = quantize_q2_K(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0xb:
    __n = quantize_q3_K(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0xc:
    __n = quantize_q4_K(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0xd:
    __n = quantize_q5_K(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0xe:
    __n = quantize_q6_K(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x10:
    __n = quantize_iq2_xxs(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x11:
    __n = quantize_iq2_xs(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x12:
    __n = quantize_iq3_xxs(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x13:
    __n = quantize_iq1_s(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x14:
    __n = quantize_iq4_nl(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x15:
    __n = quantize_iq3_s(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x16:
    __n = quantize_iq2_s(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x17:
    __n = quantize_iq4_xs(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x1d:
    __n = quantize_iq1_m(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x1e:
    if (0 < n) {
      lVar2 = 0;
      do {
        fVar1 = src[start + lVar2];
        if ((uint)ABS(fVar1) < 0x7f800001) {
          uVar5 = (ushort)(((uint)fVar1 >> 0x10 & 1) + (int)fVar1 + 0x7fff >> 0x10);
        }
        else {
          uVar5 = (ushort)((uint)fVar1 >> 0x10) | 0x40;
        }
        *(ushort *)((long)dst + lVar2 * 2 + start * 2) = uVar5;
        lVar2 = lVar2 + 1;
      } while (n - lVar2 != 0);
    }
LAB_001233bb:
    __n = n * 2;
    break;
  case 0x22:
    __n = quantize_tq1_0(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
    break;
  case 0x23:
    __n = quantize_tq2_0(src + start,(void *)((long)dst + lVar2 * uVar3),nrows,n_per_row,imatrix);
  }
switchD_0012314a_caseD_4:
  if (__n == uVar3 * nrows) {
    return __n;
  }
  pcVar4 = "result == nrows * row_size";
  line = 0x1967;
LAB_00123653:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

size_t ggml_quantize_chunk(
        enum ggml_type   type,
           const float * src,
                  void * dst,
               int64_t   start,
               int64_t   nrows,
               int64_t   n_per_row,
           const float * imatrix) {
    const int64_t n = (int64_t) nrows * n_per_row;

    if (ggml_quantize_requires_imatrix(type)) {
        GGML_ASSERT(imatrix != NULL);
    }

    GGML_ASSERT(start % type_traits[type].blck_size == 0);
    GGML_ASSERT(start % n_per_row == 0);

    ggml_quantize_init(type); // this is noop if already initialized

    const size_t start_row = start / n_per_row;
    const size_t row_size  = ggml_row_size(type, n_per_row);

    size_t result = 0;

    switch (type) {
        case GGML_TYPE_Q4_0:    result = quantize_q4_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q4_1:    result = quantize_q4_1(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q5_0:    result = quantize_q5_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q5_1:    result = quantize_q5_1(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q8_0:    result = quantize_q8_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q2_K:    result = quantize_q2_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q3_K:    result = quantize_q3_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q4_K:    result = quantize_q4_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q5_K:    result = quantize_q5_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q6_K:    result = quantize_q6_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_TQ1_0:   result = quantize_tq1_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_TQ2_0:   result = quantize_tq2_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ2_XXS: result = quantize_iq2_xxs(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ2_XS:  result = quantize_iq2_xs (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ3_XXS: result = quantize_iq3_xxs(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ3_S:   result = quantize_iq3_s  (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ2_S:   result = quantize_iq2_s  (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ1_S:   result = quantize_iq1_s  (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ1_M:   result = quantize_iq1_m  (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ4_NL:  result = quantize_iq4_nl (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ4_XS:  result = quantize_iq4_xs (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_F16:
            {
                size_t elemsize = sizeof(ggml_fp16_t);
                ggml_fp32_to_fp16_row(src + start, (ggml_fp16_t *)dst + start, n);
                result = n * elemsize;
            } break;
        case GGML_TYPE_BF16:
            {
                size_t elemsize = sizeof(ggml_bf16_t);
                ggml_fp32_to_bf16_row_ref(src + start, (ggml_bf16_t *)dst + start, n);
                result = n * elemsize;
            } break;
        case GGML_TYPE_F32:
            {
                size_t elemsize = sizeof(float);
                result = n * elemsize;
                memcpy((uint8_t *)dst + start * elemsize, src + start, result);
            } break;
        default:
            assert(false);
    }

    GGML_ASSERT(result == nrows * row_size);

    return result;
}